

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError MuxSet(WebPMux *mux,uint32_t tag,WebPData *data,int copy_data)

{
  CHUNK_INDEX CVar1;
  uint32_t in_ESI;
  CHUNK_INDEX idx;
  WebPMuxError err;
  WebPChunk chunk;
  uint32_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  WebPChunk *in_stack_ffffffffffffffb8;
  WebPMuxError local_4;
  
  local_4 = WEBP_MUX_NOT_FOUND;
  CVar1 = ChunkGetIndexFromTag(in_ESI);
  ChunkInit((WebPChunk *)0x1069a5);
  if (CVar1 == IDX_VP8X) {
    local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)((ulong)(uint)local_4 << 0x20),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_4 == WEBP_MUX_OK) {
      local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
    }
  }
  else if (CVar1 == IDX_ICCP) {
    local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)CONCAT44(local_4,1),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_4 == WEBP_MUX_OK) {
      local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
    }
  }
  else if (CVar1 == IDX_ANIM) {
    local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)CONCAT44(local_4,2),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_4 == WEBP_MUX_OK) {
      local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
    }
  }
  else if (CVar1 == IDX_EXIF) {
    local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)CONCAT44(local_4,7),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_4 == WEBP_MUX_OK) {
      local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
    }
  }
  else if (CVar1 == IDX_XMP) {
    local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)CONCAT44(local_4,8),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_4 == WEBP_MUX_OK) {
      local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
    }
  }
  else if ((CVar1 == IDX_UNKNOWN) &&
          (local_4 = ChunkAssignData(in_stack_ffffffffffffffb8,(WebPData *)CONCAT44(local_4,9),
                                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          local_4 == WEBP_MUX_OK)) {
    local_4 = ChunkSetHead(in_stack_ffffffffffffffb8,(WebPChunk **)CONCAT44(1,CVar1));
  }
  return local_4;
}

Assistant:

static WebPMuxError MuxSet(WebPMux* const mux, uint32_t tag,
                           const WebPData* const data, int copy_data) {
  WebPChunk chunk;
  WebPMuxError err = WEBP_MUX_NOT_FOUND;
  const CHUNK_INDEX idx = ChunkGetIndexFromTag(tag);
  assert(mux != NULL);
  assert(!IsWPI(kChunks[idx].id));

  ChunkInit(&chunk);
  SWITCH_ID_LIST(IDX_VP8X,    &mux->vp8x_);
  SWITCH_ID_LIST(IDX_ICCP,    &mux->iccp_);
  SWITCH_ID_LIST(IDX_ANIM,    &mux->anim_);
  SWITCH_ID_LIST(IDX_EXIF,    &mux->exif_);
  SWITCH_ID_LIST(IDX_XMP,     &mux->xmp_);
  SWITCH_ID_LIST(IDX_UNKNOWN, &mux->unknown_);
  return err;
}